

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinfo.c
# Opt level: O0

char * getkeyname(char *cp,size_t len,int k)

{
  ulong local_38;
  size_t copied;
  char *np;
  int k_local;
  size_t len_local;
  char *cp_local;
  
  np._4_4_ = k;
  if (k < 0) {
    np._4_4_ = k & 0xff;
  }
  if (np._4_4_ == 0) {
    copied = (size_t)anon_var_dwarf_1d20;
  }
  else if (np._4_4_ == 9) {
    copied = (size_t)anon_var_dwarf_1d36;
  }
  else if (np._4_4_ == 0xd) {
    copied = (size_t)anon_var_dwarf_1d4c;
  }
  else if (np._4_4_ == 0x1b) {
    copied = (size_t)anon_var_dwarf_1d56;
  }
  else if (np._4_4_ == 0x20) {
    copied = (long)"C-SPC" + 2;
  }
  else if (np._4_4_ == 0x7f) {
    copied = (size_t)anon_var_dwarf_1d6a;
  }
  else if ((((int)np._4_4_ < 0x100) || (0x100 < (int)np._4_4_)) ||
          (copied = (size_t)keystrings[(int)(np._4_4_ - 0x100)], (char *)copied == (char *)0x0)) {
    if (0x7f < (int)np._4_4_) {
      *cp = '0';
      cp[1] = ((byte)((int)np._4_4_ >> 6) & 7) + 0x30;
      cp[2] = ((byte)((int)np._4_4_ >> 3) & 7) + 0x30;
      cp[3] = ((byte)np._4_4_ & 7) + 0x30;
      cp[4] = '\0';
      return cp + 4;
    }
    len_local = (size_t)cp;
    if ((int)np._4_4_ < 0x20) {
      *cp = 'C';
      len_local = (size_t)(cp + 2);
      cp[1] = '-';
      np._4_4_ = np._4_4_ ^ 0x40;
      if ((cinfo[np._4_4_ & 0xff] & 2U) != 0) {
        np._4_4_ = np._4_4_ + 0x20;
      }
    }
    *(char *)len_local = (char)np._4_4_;
    *(char *)(len_local + 1) = '\0';
    return (char *)(len_local + 1);
  }
  local_38 = strlcpy(cp,copied,len);
  if (len <= local_38) {
    local_38 = len - 1;
  }
  return cp + local_38;
}

Assistant:

char *
getkeyname(char *cp, size_t len, int k)
{
	const char	*np;
	size_t		 copied;

	if (k < 0)
		k = CHARMASK(k);	/* sign extended char */
	switch (k) {
	case CCHR('@'):
		np = "C-SPC";
		break;
	case CCHR('I'):
		np = "TAB";
		break;
	case CCHR('M'):
		np = "RET";
		break;
	case CCHR('['):
		np = "ESC";
		break;
	case ' ':
		np = "SPC";
		break;		/* yuck again */
	case CCHR('?'):
		np = "DEL";
		break;
	default:
		if (k >= KFIRST && k <= KLAST &&
		    (np = keystrings[k - KFIRST]) != NULL)
			break;
		if (k > CCHR('?')) {
			*cp++ = '0';
			*cp++ = ((k >> 6) & 7) + '0';
			*cp++ = ((k >> 3) & 7) + '0';
			*cp++ = (k & 7) + '0';
			*cp = '\0';
			return (cp);
		} else if (k < ' ') {
			*cp++ = 'C';
			*cp++ = '-';
			k = CCHR(k);
			if (ISUPPER(k))
				k = TOLOWER(k);
		}
		*cp++ = k;
		*cp = '\0';
		return (cp);
	}
	copied = strlcpy(cp, np, len);
	if (copied >= len)
		copied = len - 1;
	return (cp + copied);
}